

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.cpp
# Opt level: O1

string * fs_realpath_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  size_t sVar1;
  char *pcVar2;
  string_view s;
  string r;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  sVar1 = fs_get_max_path();
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)sVar1);
  pcVar2 = realpath(path._M_str,(char *)local_40);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    s._M_str = (char *)local_40;
    s._M_len = local_38;
    fs_trim_abi_cxx11_(__return_storage_ptr__,s);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_realpath(std::string_view path)
{
  // resolve real path
  // not well-defined for non-existing path--may return empty string.

#ifdef _WIN32
  return fs_win32_final_path(path);
#else
  std::string r(fs_get_max_path(), '\0');

  return realpath(path.data(), r.data())
    ? fs_trim(r)
    : std::string();
#endif

}